

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPrecompileHeadersCommand.cxx
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* anon_unknown.dwarf_15da6c3::ConvertToAbsoluteContent
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *content,string *baseDir)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  reference extraout_RAX;
  size_type sVar4;
  reference pvVar5;
  reference extraout_RAX_00;
  pointer in_name;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  string absoluteSrc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string *local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  undefined8 local_a0;
  undefined1 *local_98;
  size_type local_90;
  pointer local_88;
  string local_80;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8 = baseDir;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(__return_storage_ptr__,
            (long)(content->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(content->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5);
  in_name = (content->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (content->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar5 = extraout_RAX;
  if (in_name != pbVar1) {
    do {
      local_d8._M_string_length = 0;
      local_d8.field_2._M_local_buf[0] = '\0';
      local_b0._M_str = (in_name->_M_dataplus)._M_p;
      local_b0._M_len = in_name->_M_string_length;
      __str._M_str = "<";
      __str._M_len = 1;
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_b0,0,1,__str);
      if (iVar3 == 0) {
LAB_003c596c:
        std::__cxx11::string::_M_assign((string *)&local_d8);
      }
      else {
        local_b0._M_str = (in_name->_M_dataplus)._M_p;
        local_b0._M_len = in_name->_M_string_length;
        __str_00._M_str = "\"";
        __str_00._M_len = 1;
        iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          (&local_b0,0,1,__str_00);
        if (((iVar3 == 0) || (bVar2 = cmsys::SystemTools::FileIsFullPath(in_name), bVar2)) ||
           (sVar4 = cmGeneratorExpression::Find(in_name), sVar4 == 0)) goto LAB_003c596c;
        local_b0._M_str = (local_b8->_M_dataplus)._M_p;
        local_b0._M_len = local_b8->_M_string_length;
        local_60 = 1;
        local_98 = local_50;
        local_50[0] = 0x2f;
        local_a0 = 1;
        local_88 = (in_name->_M_dataplus)._M_p;
        local_90 = in_name->_M_string_length;
        views._M_len = 3;
        views._M_array = &local_b0;
        local_58 = local_98;
        cmCatViews_abi_cxx11_(&local_80,views);
        std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
      }
      pvVar5 = std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
               emplace_back<std::__cxx11::string>
                         ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                          __return_storage_ptr__,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,
                        CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                                 local_d8.field_2._M_local_buf[0]) + 1);
        pvVar5 = extraout_RAX_00;
      }
      in_name = in_name + 1;
    } while (in_name != pbVar1);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)pvVar5;
}

Assistant:

std::vector<std::string> ConvertToAbsoluteContent(
  const std::vector<std::string>& content, std::string const& baseDir)
{
  std::vector<std::string> absoluteContent;
  absoluteContent.reserve(content.size());
  for (std::string const& src : content) {
    std::string absoluteSrc;
    // Use '<foo.h>' and '"foo.h"' includes and absolute paths as-is.
    // Interpret relative paths with respect to the source directory.
    // If the path starts in a generator expression, assume it is absolute.
    if (cmHasLiteralPrefix(src, "<") || cmHasLiteralPrefix(src, "\"") ||
        cmSystemTools::FileIsFullPath(src) ||
        cmGeneratorExpression::Find(src) == 0) {
      absoluteSrc = src;
    } else {
      absoluteSrc = cmStrCat(baseDir, '/', src);
    }
    absoluteContent.emplace_back(std::move(absoluteSrc));
  }
  return absoluteContent;
}